

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

bool __thiscall GF2::VSubst<8UL>::IsFullCycle(VSubst<8UL> *this)

{
  word in_RDI;
  size_t count;
  word x;
  Func<8UL,_GF2::WW<8UL>_> *in_stack_ffffffffffffffd8;
  long local_20;
  WW local_18 [8];
  word local_10;
  
  Func<8UL,_GF2::WW<8UL>_>::Get(in_stack_ffffffffffffffd8,in_RDI);
  local_10 = GF2::WW::operator_cast_to_unsigned_long(local_18);
  local_20 = 1;
  while (local_10 != 0) {
    Func<8UL,_GF2::WW<8UL>_>::Get(in_stack_ffffffffffffffd8,in_RDI);
    local_10 = GF2::WW::operator_cast_to_unsigned_long((WW *)&stack0xffffffffffffffd8);
    local_20 = local_20 + 1;
  }
  return local_20 == 0x100;
}

Assistant:

bool IsFullCycle() const
	{	
		assert(IsBijection());
		word x = Get(0);
		size_t count = 1;
		while (x != 0)
			x = Get(x), ++count;
		return count == _size;
	}